

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O1

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoLinear>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZGeoLinear> *this,void **vtt,TPZGeoMesh *DestMesh,
          TPZGeoElRefPattern<pzgeom::TPZGeoLinear> *cp)

{
  atomic_int *paVar1;
  void *pvVar2;
  TPZReference *pTVar3;
  
  TPZGeoElRefLess<pzgeom::TPZGeoLinear>::TPZGeoElRefLess
            (&this->super_TPZGeoElRefLess<pzgeom::TPZGeoLinear>,vtt + 1,DestMesh,
             &cp->super_TPZGeoElRefLess<pzgeom::TPZGeoLinear>);
  pvVar2 = *vtt;
  *(void **)&(this->super_TPZGeoElRefLess<pzgeom::TPZGeoLinear>).super_TPZGeoEl = pvVar2;
  *(void **)((long)(this->super_TPZGeoElRefLess<pzgeom::TPZGeoLinear>).fGeo.
                   super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes +
            *(long *)((long)pvVar2 + -0x60) + -0x48) = vtt[5];
  (this->fSubEl)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  (this->fSubEl).fStore = (long *)0x0;
  (this->fSubEl).fNElements = 0;
  (this->fSubEl).fNAlloc = 0;
  pTVar3 = (cp->fRefPattern).fRef;
  (this->fRefPattern).fRef = pTVar3;
  LOCK();
  paVar1 = &pTVar3->fCounter;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  TPZVec<long>::operator=(&this->fSubEl,&cp->fSubEl);
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern(TPZGeoMesh &DestMesh, const TPZGeoElRefPattern<TGeo> &cp):
TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),TPZGeoElRefLess<TGeo>(DestMesh,cp),
fRefPattern(cp.fRefPattern) {

	this->fSubEl = cp.fSubEl;
}